

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O1

int CfdGetAddressFromLockingScript
              (void *handle,char *locking_script,int network_type,char **address)

{
  bool bVar1;
  NetType type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  AddressFactory address_factory;
  Script script;
  Address addr;
  bool local_381;
  AddressFactory local_380;
  Script local_358;
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  pointer local_2f0;
  pointer local_2d8;
  pointer local_2c0;
  TapBranch local_2a8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_230;
  Script local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  undefined1 local_1a8 [32];
  char local_188 [16];
  pointer local_178;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(locking_script);
  if (bVar1) {
    local_320._0_8_ = "cfdcapi_address.cpp";
    local_320._8_4_ = 0x403;
    local_320._16_8_ = "CfdGetAddressFromLockingScript";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_320,kCfdLogLevelWarning,"lockingScript is null or empty.")
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_320,"Failed to parameter. lockingScript is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_320);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (address != (char **)0x0) {
    local_381 = false;
    type = cfd::capi::ConvertNetType(network_type,&local_381);
    std::__cxx11::string::string((string *)local_320,locking_script,(allocator *)local_1a8);
    cfd::core::Script::Script(&local_358,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_);
    }
    cfd::core::Address::Address((Address *)local_320);
    if (local_381 == true) {
      cfd::AddressFactory::AddressFactory(&local_380,type);
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_1a8,&local_380,&local_358);
      cfd::core::Address::operator=((Address *)local_320,(Address *)local_1a8);
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_380,type)
      ;
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_1a8,&local_380,&local_358);
      cfd::core::Address::operator=((Address *)local_320,(Address *)local_1a8);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    cfd::core::Script::~Script(&local_a0);
    local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8)
    ;
    cfd::core::TapBranch::~TapBranch(&local_130);
    if (local_148 != (pointer)0x0) {
      operator_delete(local_148);
    }
    if (local_160 != (pointer)0x0) {
      operator_delete(local_160);
    }
    if (local_178 != (pointer)0x0) {
      operator_delete(local_178);
    }
    if ((char *)local_1a8._16_8_ != local_188) {
      operator_delete((void *)local_1a8._16_8_);
    }
    local_380._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_380.prefix_list_);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1a8,(Address *)local_320);
    pcVar2 = cfd::capi::CreateString((string *)local_1a8);
    *address = pcVar2;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1d8);
    cfd::core::Script::~Script(&local_218);
    local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_230);
    cfd::core::TapBranch::~TapBranch(&local_2a8);
    if (local_2c0 != (pointer)0x0) {
      operator_delete(local_2c0);
    }
    if (local_2d8 != (pointer)0x0) {
      operator_delete(local_2d8);
    }
    if (local_2f0 != (pointer)0x0) {
      operator_delete(local_2f0);
    }
    if ((undefined1 *)local_320._16_8_ != local_300) {
      operator_delete((void *)local_320._16_8_);
    }
    cfd::core::Script::~Script(&local_358);
    return 0;
  }
  local_320._0_8_ = "cfdcapi_address.cpp";
  local_320._8_4_ = 0x409;
  local_320._16_8_ = "CfdGetAddressFromLockingScript";
  cfd::core::logger::log<>((CfdSourceLocation *)local_320,kCfdLogLevelWarning,"address is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"Failed to parameter. address is null.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_320);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetAddressFromLockingScript(
    void* handle, const char* locking_script, int network_type,
    char** address) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(locking_script)) {
      warn(CFD_LOG_SOURCE, "lockingScript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. lockingScript is null or empty.");
    }
    if (address == nullptr) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    Script script = Script(locking_script);
    Address addr;

    if (is_bitcoin) {
      AddressFactory address_factory(net_type);
      addr = address_factory.GetAddressByLockingScript(script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory elements_factory(net_type);
      addr = elements_factory.GetAddressByLockingScript(script);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    *address = CreateString(addr.GetAddress());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return error_code;
}